

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

void __thiscall HPreData::printAR(HPreData *this,int i)

{
  uint uVar1;
  pointer pdVar2;
  pointer piVar3;
  HPreData *pHVar4;
  long lVar5;
  ostream *poVar6;
  int i_2;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  size_t i_1;
  ulong uVar10;
  char buff [4];
  char local_44 [4];
  ulong local_40;
  HPreData *local_38;
  
  pHVar4 = (HPreData *)&this->numColOriginal;
  if (i == 0) {
    pHVar4 = this;
  }
  local_40 = (ulong)(uint)(&this->numRow)[i != 0];
  uVar1 = pHVar4->numCol;
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  for (uVar10 = 0;
      pdVar2 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      uVar10 = uVar10 + 1) {
    sprintf(local_44,"%2.1g ",pdVar2[uVar10]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,local_44);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"------AR-|-b-----\n");
  uVar8 = 0;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar8;
  }
  iVar9 = (int)local_40;
  local_40 = local_40 & 0xffffffff;
  if (iVar9 < 1) {
    local_40 = uVar8;
  }
  local_38 = this;
  do {
    if (uVar8 == local_40) {
      std::operator<<((ostream *)&std::cout,"------l------\n");
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] <= -1e+200) {
          local_40 = local_40 & 0xffffffffffffff00;
          builtin_strncpy(local_44,"-inf",4);
        }
        else {
          sprintf(local_44,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,local_44);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<((ostream *)&std::cout,"------u------\n");
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8]) {
          builtin_strncpy(local_44,"inf",4);
        }
        else {
          sprintf(local_44,"%2.1g ");
        }
        *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
        std::operator<<((ostream *)&std::cout,local_44);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return;
    }
    for (iVar9 = 0; iVar9 != (int)uVar10; iVar9 = iVar9 + 1) {
      piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar5 = (long)piVar3[uVar8];
          (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] != iVar9; lVar5 = lVar5 + 1) {
        pcVar7 = "   ";
        if (piVar3[uVar8 + 1] <= lVar5) goto LAB_0014b61e;
      }
      pcVar7 = "   ";
      if ((int)lVar5 < piVar3[uVar8 + 1]) {
        sprintf(local_44,"%2.1g ",
                (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5]);
        this = local_38;
        pcVar7 = local_44;
      }
LAB_0014b61e:
      *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
      std::operator<<((ostream *)&std::cout,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"  |   ");
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 5;
    poVar6 = std::ostream::_M_insert<double>
                       ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar6," < < ");
    poVar6 = std::ostream::_M_insert<double>
                       ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar8]);
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void HPreData::printAR(int i) {
	int rows=numRow, cols=numCol;
	if (i) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	cout<<"\n-----cost-----\n";

	char buff [4];
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<rows;i++) {
		for (int j=0;j<cols;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff;
				}
			else cout<<std::setw(5)<<"   ";

		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<cols;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<cols;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}